

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::TestAllTypesInit(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  FunctionData *pFVar1;
  LogicalType *pLVar2;
  pointer pTVar3;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar4;
  vector<duckdb::Value,std::allocator<duckdb::Value>> *this_00;
  pointer *__ptr;
  TestType *test_type;
  LogicalType *__args;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::TestAllTypesData_*,_false> local_28;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  pFVar1 = (input->bind_data).ptr;
  local_28._M_head_impl = (TestAllTypesData *)operator_new(0x28);
  ((local_28._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__TestAllTypesData_02495000;
  ((local_28._M_head_impl)->entries).
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_28._M_head_impl)->entries).
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_28._M_head_impl)->entries).
  super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_28._M_head_impl)->offset = 0;
  pTVar3 = unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
           ::operator->((unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
                         *)&local_28);
  ::std::
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ::resize(&(pTVar3->entries).
            super_vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
           ,3);
  pLVar2 = (LogicalType *)pFVar1[5]._vptr_FunctionData;
  for (__args = (LogicalType *)pFVar1[4]._vptr_FunctionData; __args != pLVar2;
      __args = (LogicalType *)
               &__args[7].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    pTVar3 = unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
             ::operator->((unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
                           *)&local_28);
    pvVar4 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
             vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[](&pTVar3->entries,0);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              (pvVar4,(value_type *)&__args[2].type_info_);
    pTVar3 = unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
             ::operator->((unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
                           *)&local_28);
    pvVar4 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
             vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[](&pTVar3->entries,1);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              (pvVar4,(value_type *)(__args + 5));
    pTVar3 = unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
             ::operator->((unique_ptr<duckdb::TestAllTypesData,_std::default_delete<duckdb::TestAllTypesData>,_true>
                           *)&local_28);
    this_00 = (vector<duckdb::Value,std::allocator<duckdb::Value>> *)
              vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[](&pTVar3->entries,2);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<duckdb::LogicalType_const&>(this_00,__args);
  }
  *(TestAllTypesData **)this = local_28._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<GlobalTableFunctionState> TestAllTypesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<TestAllTypesBindData>();
	auto result = make_uniq<TestAllTypesData>();
	// 3 rows: min, max and NULL
	result->entries.resize(3);
	// initialize the values
	for (auto &test_type : bind_data.test_types) {
		result->entries[0].push_back(test_type.min_value);
		result->entries[1].push_back(test_type.max_value);
		result->entries[2].emplace_back(test_type.type);
	}
	return std::move(result);
}